

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(int lhs,SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar1;
  bool bVar2;
  unsigned_short uVar3;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_SI;
  int in_EDI;
  int ret;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  undefined2 in_stack_ffffffffffffffe8;
  undefined4 uVar4;
  undefined2 in_stack_fffffffffffffff0;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  SVar5;
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff6;
  unsigned_short local_2;
  
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
           *)&stack0xfffffffffffffff6);
  SVar5.m_int = in_SI.m_int;
  bVar2 = DivisionCornerCaseHelper<unsigned_short,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
          ::DivisionCornerCase1
                    (in_EDI,in_SI,
                     (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)&stack0xfffffffffffffff6);
  SVar1.m_int = in_stack_fffffffffffffff6.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<unsigned_short,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_0>
              ::DivisionCornerCase2
                        (in_EDI,in_SI,
                         (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)&stack0xfffffffffffffff6), SVar1.m_int = in_stack_fffffffffffffff6.m_int
     , !bVar2)) {
    uVar4 = 0;
    uVar3 = SafeInt::operator_cast_to_unsigned_short
                      ((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT26(in_stack_fffffffffffffff6.m_int,
                                   CONCAT24(SVar5.m_int,
                                            CONCAT22(in_SI.m_int,in_stack_fffffffffffffff0))));
    DivisionHelper<int,unsigned_short,4>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((int *)CONCAT26(in_stack_fffffffffffffff6.m_int,
                               CONCAT24(SVar5.m_int,CONCAT22(in_SI.m_int,in_stack_fffffffffffffff0))
                              ),
               (unsigned_short *)CONCAT44(uVar4,CONCAT22(uVar3,in_stack_ffffffffffffffe8)),
               (int *)0x172aa3);
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<int>((SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT26(in_stack_fffffffffffffff6.m_int,
                               CONCAT24(SVar5.m_int,CONCAT22(in_SI.m_int,in_stack_fffffffffffffff0))
                              ),(int *)CONCAT44(uVar4,CONCAT22(uVar3,in_stack_ffffffffffffffe8)));
    SVar1.m_int = local_2;
  }
  local_2 = SVar1.m_int;
  return (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )local_2;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}